

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O3

void Gia_ManFraigSweepPerform(Gia_Man_t *p,void *pPars)

{
  Aig_Man_t *pAig;
  
  pAig = Gia_ManToAigSimple(p);
  if (p->nObjs == pAig->vObjs->nSize - pAig->nDeleted) {
    Dch_ComputeEquivalences(pAig,(Dch_Pars_t *)pPars);
    Gia_ManReprFromAigRepr(pAig,p);
    Aig_ManStop(pAig);
    return;
  }
  __assert_fail("Gia_ManObjNum(p) == Aig_ManObjNum(pNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSweep.c"
                ,0x236,"void Gia_ManFraigSweepPerform(Gia_Man_t *, void *)");
}

Assistant:

void Gia_ManFraigSweepPerform( Gia_Man_t * p, void * pPars )
{
    Aig_Man_t * pNew;
    pNew = Gia_ManToAigSimple( p );
    assert( Gia_ManObjNum(p) == Aig_ManObjNum(pNew) );
    Dch_ComputeEquivalences( pNew, (Dch_Pars_t *)pPars );
    Gia_ManReprFromAigRepr( pNew, p );
    Aig_ManStop( pNew );
}